

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O2

Errors * anon_unknown.dwarf_cf2ac::ParseInvalidModule(Errors *__return_storage_ptr__,string *text)

{
  string_view filename;
  pointer *__ptr;
  char *message;
  Message local_68;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  undefined4 uStack_50;
  Result result;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  WastParseOptions local_2b;
  
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  filename._M_len._1_7_ = gtest_ar._1_7_;
  filename._M_len._0_1_ = gtest_ar.success_;
  filename._M_str =
       (char *)gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  wabt::WastLexer::CreateBufferLexer
            (filename,(void *)CONCAT44(result.enum_,uStack_50),
             (size_t)lexer._M_t.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,
             (Errors *)
             module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
             super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
  module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
       (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
  local_2b.features.exceptions_enabled_ = false;
  local_2b.features.mutable_globals_enabled_ = true;
  local_2b.features.sat_float_to_int_enabled_ = true;
  local_2b.features.sign_extension_enabled_ = true;
  local_2b.features.simd_enabled_ = true;
  local_2b.features.threads_enabled_ = false;
  local_2b.features.function_references_enabled_ = false;
  local_2b.features.multi_value_enabled_ = true;
  local_2b.features.tail_call_enabled_ = false;
  local_2b.features.bulk_memory_enabled_ = true;
  local_2b.features.reference_types_enabled_ = true;
  local_2b.features.annotations_enabled_ = false;
  local_2b.features.code_metadata_enabled_ = false;
  local_2b.features.gc_enabled_ = false;
  local_2b.features.memory64_enabled_ = false;
  local_2b.features.multi_memory_enabled_ = false;
  local_2b.features.extended_const_enabled_ = false;
  local_2b.features.relaxed_simd_enabled_ = false;
  local_2b.debug_parsing = false;
  result = wabt::ParseWatModule
                     ((WastLexer *)
                      lexer._M_t.
                      super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                      .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&module,
                      __return_storage_ptr__,&local_2b);
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&gtest_ar,"Result::Error","result",(Enum *)&local_68,&result);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_68);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-wast-parser.cc"
               ,0x2c,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&module);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
  return __return_storage_ptr__;
}

Assistant:

Errors ParseInvalidModule(std::string text) {
  Errors errors;
  auto lexer =
      WastLexer::CreateBufferLexer("test", text.c_str(), text.size(), &errors);
  std::unique_ptr<Module> module;
  Features features;
  WastParseOptions options(features);
  Result result = ParseWatModule(lexer.get(), &module, &errors, &options);
  EXPECT_EQ(Result::Error, result);

  return errors;
}